

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZArc3D> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZArc3D> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  iterator iVar4;
  mapped_type_conflict *pmVar5;
  TPZGeoElSide neigh;
  key_type_conflict1 local_68;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine> + -2) +
            *(long *)((long)pvVar1 + -0x60)) = vtt[3];
  pzgeom::TPZArc3D::TPZArc3D(&this->fGeo,&cp->fGeo,gl2lcNdMap);
  lVar3 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar3) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar3) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar3) = 0xffffffffffffffff;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    TPZGeoElSide::TPZGeoElSide(&local_60,cp->fNeighbours + lVar3,(cp->super_TPZGeoEl).fMesh);
    while( true ) {
      iVar2 = local_60.fSide;
      local_68 = (local_60.fGeoEl)->fIndex;
      iVar4 = std::
              _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
              ::find(&gl2lcElMap->_M_t,&local_68);
      if ((_Rb_tree_header *)iVar4._M_node != &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header)
      break;
      TPZGeoElSide::Neighbour(&local_48,&local_60);
      local_60.fSide = local_48.fSide;
      local_60.fGeoEl = local_48.fGeoEl;
    }
    pmVar5 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcElMap,&local_68);
    this->fNeighbours[lVar3].fGeoElIndex = *pmVar5;
    this->fNeighbours[lVar3].fSide = iVar2;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}